

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

bool flatbuffers::anon_unknown_101::VerifyVectorOfStructs
               (Verifier *v,Table *parent_table,voffset_t field_offset,Object *obj,bool required)

{
  bool bVar1;
  ushort uVar2;
  size_t elem_size;
  Table *vec;
  
  if (field_offset < *(ushort *)(parent_table + -(long)*(int *)parent_table)) {
    uVar2 = *(ushort *)(parent_table + ((ulong)field_offset - (long)*(int *)parent_table));
  }
  else {
    uVar2 = 0;
  }
  if (uVar2 == 0) {
    vec = (Table *)0x0;
  }
  else {
    vec = parent_table + (ulong)*(uint *)(parent_table + uVar2) + (ulong)uVar2;
  }
  if (vec != (Table *)0x0) {
    if (*(ushort *)(obj + -(long)*(int *)obj) < 0xd) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)(obj + (0xc - (long)*(int *)obj));
    }
    if (uVar2 == 0) {
      elem_size = 0;
    }
    else {
      elem_size = (size_t)*(int *)(obj + uVar2);
    }
    bVar1 = VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                      (v,(uint8_t *)vec,elem_size,(size_t *)0x0);
    return bVar1;
  }
  return vec != (Table *)0x0 || !required;
}

Assistant:

T ReadScalar(const void *p) {
  return EndianScalar(*reinterpret_cast<const T *>(p));
}